

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O1

void __thiscall xercesc_4_0::WFElemStack::addPrefix(WFElemStack *this,XMLCh *prefixToAdd,uint uriId)

{
  int iVar1;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar2;
  StackElem *pSVar3;
  PrefMapElem *pPVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  PoolElem *pPVar8;
  EmptyStackException *this_00;
  XMLCh *pXVar9;
  XMLCh XVar10;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar11;
  
  if (this->fStackTop == 0) {
    this_00 = (EmptyStackException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ElemStack.cpp"
               ,0x2d0,ElemStack_EmptyStack,this->fMemoryManager);
    __cxa_throw(this_00,&EmptyStackException::typeinfo,XMLException::~XMLException);
  }
  pRVar2 = (this->fPrefixPool).fHashTable;
  pSVar3 = this->fStack[this->fStackTop - 1];
  if ((prefixToAdd == (XMLCh *)0x0) || (uVar7 = (ulong)(ushort)*prefixToAdd, uVar7 == 0)) {
    uVar7 = 0;
  }
  else {
    XVar10 = prefixToAdd[1];
    if (XVar10 != L'\0') {
      pXVar9 = prefixToAdd + 2;
      do {
        uVar7 = (ulong)(ushort)XVar10 + (uVar7 >> 0x18) + uVar7 * 0x26;
        XVar10 = *pXVar9;
        pXVar9 = pXVar9 + 1;
      } while (XVar10 != L'\0');
    }
    uVar7 = uVar7 % pRVar2->fHashModulus;
  }
  pRVar11 = pRVar2->fBucketList[uVar7];
  if (pRVar11 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar5 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,prefixToAdd,pRVar11->fKey);
      if (bVar5) goto LAB_002a5423;
      pRVar11 = pRVar11->fNext;
    } while (pRVar11 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  pRVar11 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
LAB_002a5423:
  if (pRVar11 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    pPVar8 = (PoolElem *)0x0;
  }
  else {
    pPVar8 = pRVar11->fData;
  }
  if (pPVar8 == (PoolElem *)0x0) {
    uVar6 = XMLStringPool::addNewEntry(&this->fPrefixPool,prefixToAdd);
  }
  else {
    uVar6 = pPVar8->fId;
  }
  if (this->fMapCapacity == (ulong)(pSVar3->fTopPrefix + 1)) {
    expandMap(this);
  }
  pPVar4 = this->fMap;
  iVar1 = pSVar3->fTopPrefix;
  pPVar4[(long)iVar1 + 1].fPrefId = uVar6;
  pPVar4[(long)iVar1 + 1].fURIId = uriId;
  pSVar3->fTopPrefix = iVar1 + 1;
  return;
}

Assistant:

void WFElemStack::addPrefix(  const   XMLCh* const    prefixToAdd
                              , const unsigned int    uriId)
{
    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if ((unsigned int)curRow->fTopPrefix + 1 == fMapCapacity)
        expandMap();

    //
    //  And now add a new element for this prefix. Watch for the special case
    //  of xmlns=="", and force it to ""=[globalid]
    //
    fMap[curRow->fTopPrefix + 1].fPrefId = prefId;
    if ((prefId == fGlobalPoolId) && (uriId == fEmptyNamespaceId))
        fMap[curRow->fTopPrefix + 1].fURIId = fEmptyNamespaceId;
    else
        fMap[curRow->fTopPrefix + 1].fURIId = uriId;

    // Bump the map count now
    curRow->fTopPrefix++;
}